

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O2

void __thiscall asmjit::v1_14::ConstPool::fill(ConstPool *this,void *dst)

{
  long lVar1;
  ConstPoolFill filler;
  
  memset(dst,0,this->_size);
  filler._dataSize = 1;
  filler._dst = (uint8_t *)dst;
  for (lVar1 = 8; lVar1 != 0xb0; lVar1 = lVar1 + 0x18) {
    Tree::forEach<asmjit::v1_14::ConstPoolFill>((Tree *)((long)&this->_zone + lVar1),&filler);
    filler._dataSize = filler._dataSize << 1;
  }
  return;
}

Assistant:

void ConstPool::fill(void* dst) const noexcept {
  // Clears possible gaps, asmjit should never emit garbage to the output.
  memset(dst, 0, _size);

  ConstPoolFill filler(static_cast<uint8_t*>(dst), 1);
  for (size_t i = 0; i < ASMJIT_ARRAY_SIZE(_tree); i++) {
    _tree[i].forEach(filler);
    filler._dataSize <<= 1;
  }
}